

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc.c
# Opt level: O3

void etdc_gencodes(etdc_table *table)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uchar *puVar8;
  int iVar9;
  int iVar10;
  
  if (table != (etdc_table *)0x0) {
    iVar1 = 0x80;
    uVar2 = 0xffffffff;
    uVar3 = 1;
    iVar5 = 0;
    iVar6 = 0;
    iVar7 = 0;
    do {
      if (iVar1 != 0) {
        iVar9 = 0;
        do {
          iVar4 = iVar9 + 0x7f;
          if (-1 < iVar9) {
            iVar4 = iVar9;
          }
          table->code[uVar3 - 1] = ((char)iVar9 - ((byte)iVar4 & 0x80)) + 0x80;
          if (1 < uVar3) {
            puVar8 = table->code + uVar2;
            iVar4 = iVar5;
            do {
              iVar10 = iVar9 + 0x7f;
              if (-1 < iVar9) {
                iVar10 = iVar9;
              }
              iVar9 = iVar10 >> 7;
              iVar10 = iVar9 + 0x7f;
              if (-1 < iVar9) {
                iVar10 = iVar9;
              }
              *puVar8 = (char)iVar9 - ((byte)iVar10 & 0x80);
              iVar4 = iVar4 + -1;
              puVar8 = puVar8 + -1;
            } while (0 < iVar4);
          }
          table->size = (int)uVar3;
          iVar6 = iVar6 + 1;
          table = (etdc_table *)(table->hh).next;
        } while ((table != (etdc_table *)0x0) && (iVar9 = iVar6 - iVar7, iVar9 < iVar1));
      }
      uVar3 = uVar3 + 1;
      iVar7 = iVar7 + iVar1;
      iVar1 = iVar1 << 7;
      uVar2 = uVar2 + 1;
      iVar5 = iVar5 + 1;
    } while (table != (etdc_table *)0x0);
  }
  return;
}

Assistant:

void etdc_gencodes(struct etdc_table *table) {
  struct etdc_table *s;
  int paux;
  int first;
  int num;
  int p;
  int i,k;
  first = 0;
  num = 128;
  k = 1;
  p = 0;
  for(s=table; s != NULL;) {
    paux = 0;

    for(; (s != (struct etdc_table*)NULL) && (paux < num); s=(struct etdc_table*)s->hh.next) {
      s->code[k - 1] = 128 + paux % 128;
      paux = paux / 128;

      for( i = k -2; i >= 0; i--) {
	s->code[i] = paux % 128;
	paux = paux / 128;
      }
      s->size = k;

      p++;
      paux = p - first;
    }
    k++;
    first = first + num;
    num = num*128;
  }

}